

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

bool __thiscall
lzham::symbol_codec::encode(symbol_codec *this,uint sym,quasi_adaptive_huffman_data_model *model)

{
  unsigned_short uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  unsigned_short *puVar5;
  raw_quasi_adaptive_huffman_data_model *in_RDX;
  uint in_ESI;
  long in_RDI;
  uint freq;
  undefined4 in_stack_ffffffffffffffdc;
  bool local_1;
  
  puVar5 = vector<unsigned_short>::operator[](&in_RDX->m_codes,in_ESI);
  uVar3 = (uint)*puVar5;
  vector<unsigned_char>::operator[](&in_RDX->m_code_sizes,in_ESI);
  bVar2 = record_put_bits((symbol_codec *)CONCAT44(in_stack_ffffffffffffffdc,uVar3),
                          (uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  if (bVar2) {
    puVar5 = vector<unsigned_short>::operator[](&in_RDX->m_sym_freq,in_ESI);
    uVar1 = *puVar5;
    puVar5 = vector<unsigned_short>::operator[](&in_RDX->m_sym_freq,in_ESI);
    *puVar5 = uVar1 + 1;
    uVar4 = in_RDX->m_symbols_until_update - 1;
    in_RDX->m_symbols_until_update = uVar4;
    if (uVar4 == 0) {
      *(int *)(in_RDI + 0x44) = *(int *)(in_RDI + 0x44) + 1;
      bVar2 = raw_quasi_adaptive_huffman_data_model::update(in_RDX);
      if (!bVar2) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool symbol_codec::encode(uint sym, quasi_adaptive_huffman_data_model& model)
   {
      LZHAM_ASSERT(m_mode == cEncoding);
      LZHAM_ASSERT(model.m_encoding);

      if (!record_put_bits(model.m_codes[sym], model.m_code_sizes[sym]))
         return false;

      uint freq = model.m_sym_freq[sym];
      freq++;
      model.m_sym_freq[sym] = static_cast<uint16>(freq);
      
      LZHAM_ASSERT(freq <= UINT16_MAX);

      if (--model.m_symbols_until_update == 0)
      {
         m_total_model_updates++;
         if (!model.update())
            return false;
      }
      return true;
   }